

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

curl_off_t Curl_mime_size(curl_mimepart *part)

{
  size_t sVar1;
  curl_off_t cVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  char *skip;
  curl_off_t cVar6;
  curl_mimepart *part_00;
  undefined1 auVar7 [16];
  
  if (part->kind == MIMEKIND_MULTIPART) {
    part_00 = (curl_mimepart *)part->arg;
    if (part_00 == (curl_mimepart *)0x0) {
      cVar6 = 0;
    }
    else {
      sVar1 = strlen(part_00->data);
      in_RDX = extraout_RDX;
      cVar6 = sVar1 + 6;
      while (part_00 = part_00->nextpart, part_00 != (curl_mimepart *)0x0) {
        cVar2 = Curl_mime_size(part_00);
        if (cVar2 < 0) {
          cVar6 = cVar2;
        }
        if (cVar6 < 0) {
          lVar3 = 0;
        }
        else {
          lVar3 = cVar2 + sVar1 + 6;
        }
        cVar6 = cVar6 + lVar3;
        in_RDX = extraout_RDX_00;
      }
    }
    part->datasize = cVar6;
  }
  else {
    cVar6 = part->datasize;
  }
  auVar7._8_8_ = in_RDX;
  auVar7._0_8_ = cVar6;
  if (part->encoder != (mime_encoder *)0x0) {
    auVar7 = (undefined1  [16])(*part->encoder->sizefunc)(part);
  }
  cVar6 = auVar7._0_8_;
  if ((-1 < cVar6) && ((part->flags & 2) == 0)) {
    sVar4 = slist_size(part->curlheaders,0,auVar7._8_8_);
    sVar5 = slist_size(part->userheaders,0x42926f,skip);
    cVar6 = cVar6 + sVar4 + sVar5 + 2;
  }
  return cVar6;
}

Assistant:

curl_off_t Curl_mime_size(curl_mimepart *part)
{
  curl_off_t size;

  if(part->kind == MIMEKIND_MULTIPART)
    part->datasize = multipart_size(part->arg);

  size = part->datasize;

  if(part->encoder)
    size = part->encoder->sizefunc(part);

  if(size >= 0 && !(part->flags & MIME_BODY_ONLY)) {
    /* Compute total part size. */
    size += slist_size(part->curlheaders, 2, NULL);
    size += slist_size(part->userheaders, 2, "Content-Type");
    size += 2;    /* CRLF after headers. */
  }
  return size;
}